

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O2

void __thiscall OpenMD::Globals::validate(Globals *this)

{
  double dVar1;
  int iVar2;
  pointer pcVar3;
  unsigned_long uVar4;
  size_type sVar5;
  bool bVar6;
  ostream *poVar7;
  OpenMDException *this_00;
  pointer ppCVar8;
  allocator<char> local_4da2;
  allocator<char> local_4da1;
  allocator<char> local_4da0;
  allocator<char> local_4d9f;
  allocator<char> local_4d9e;
  allocator<char> local_4d9d;
  allocator<char> local_4d9c;
  allocator<char> local_4d9b;
  allocator<char> local_4d9a;
  allocator<char> local_4d99;
  allocator<char> local_4d98;
  allocator<char> local_4d97;
  allocator<char> local_4d96;
  allocator<char> local_4d95;
  allocator<char> local_4d94;
  allocator<char> local_4d93;
  allocator<char> local_4d92;
  allocator<char> local_4d91;
  EqualIgnoreCaseConstraint local_4d90;
  EqualIgnoreCaseConstraint local_4d50;
  EqualIgnoreCaseConstraint local_4d10;
  EqualIgnoreCaseConstraint local_4cd0;
  EqualIgnoreCaseConstraint local_4c90;
  EqualIgnoreCaseConstraint local_4c50;
  EqualIgnoreCaseConstraint local_4c10;
  string local_4bd0;
  string local_4bb0;
  string local_4b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b70;
  string local_4b50;
  string local_4b30;
  string local_4b10;
  string local_4af0;
  string local_4ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4ab0;
  string local_4a90;
  string local_4a70;
  string local_4a50;
  string local_4a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a10;
  string local_49f0;
  string local_49d0;
  string local_49b0;
  string local_4990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4970;
  string local_4950;
  string local_4930;
  string local_4910;
  string local_48f0;
  string local_48d0;
  string local_48b0;
  string local_4890;
  string local_4870;
  string local_4850;
  string local_4830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4810;
  string local_47f0;
  string local_47d0;
  string local_47b0;
  string local_4790;
  string local_4770;
  string local_4750;
  string local_4730;
  string local_4710;
  string local_46f0;
  string local_46d0;
  string local_46b0;
  string local_4690;
  string local_4670;
  string local_4650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4630;
  string local_4610;
  string local_45f0;
  string local_45d0;
  string local_45b0;
  string local_4590;
  string local_4570;
  string local_4550;
  string local_4530;
  string local_4510;
  string local_44f0;
  string local_44d0;
  string local_44b0;
  string local_4490;
  string local_4470;
  string local_4450;
  string local_4430;
  string local_4410;
  string local_43f0;
  string local_43d0;
  string local_43b0;
  string local_4390;
  string local_4370;
  string local_4350;
  string local_4330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4310;
  string local_42f0;
  EqualIgnoreCaseConstraint local_42d0;
  string local_4290;
  EqualIgnoreCaseConstraint local_4270;
  string local_4230;
  EqualIgnoreCaseConstraint local_4210;
  string local_41d0;
  EqualIgnoreCaseConstraint local_41b0;
  string local_4170;
  EqualIgnoreCaseConstraint local_4150;
  string local_4110;
  EqualIgnoreCaseConstraint local_40f0;
  string local_40b0;
  EqualIgnoreCaseConstraint local_4090;
  string local_4050;
  EqualIgnoreCaseConstraint local_4030;
  string local_3ff0;
  EqualIgnoreCaseConstraint local_3fd0;
  string local_3f90;
  EqualIgnoreCaseConstraint local_3f70;
  string local_3f30;
  EqualIgnoreCaseConstraint local_3f10;
  string local_3ed0;
  string local_3eb0;
  string local_3e90;
  string local_3e70;
  string local_3e50;
  string local_3e30;
  string local_3e10;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_3df0;
  ostringstream oss;
  undefined8 local_3110 [4];
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_30f0
  ;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_3050;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_2ef0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_2df0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_2c30;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_2650;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_2430;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_2150;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_1ed0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_1950;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_1430;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_10f0;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_d50;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_950;
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  local_490;
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->ForceField).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    std::__cxx11::string::string((string *)&local_3df0,(string *)&(this->ForceField).data_);
    sVar5 = local_3df0.
            super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
            .description_._M_string_length;
    std::__cxx11::string::~string((string *)&local_3df0);
    std::__cxx11::string::~string((string *)&oss);
    if (sVar5 == 0) {
      pcVar3 = (this->ForceField).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TargetTemp).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->TargetTemp).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->TargetTemp).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Ensemble).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e10,"NVE",(allocator<char> *)local_3110);
    isEqualIgnoreCase(&local_4d90,&local_3e10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e30,"NVT",&local_4d92);
    isEqualIgnoreCase(&local_4c50,&local_3e30);
    OpenMD::operator||(&local_30f0,
                       &local_4d90.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_4c50.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e50,"NPTi",&local_4d93);
    isEqualIgnoreCase(&local_4c90,&local_3e50);
    OpenMD::operator||(&local_2ef0,
                       &local_30f0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4c90.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e70,"NPTf",&local_4d94);
    isEqualIgnoreCase(&local_4cd0,&local_3e70);
    OpenMD::operator||(&local_3050,
                       &local_2ef0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4cd0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e90,"NPTxyz",&local_4d95);
    isEqualIgnoreCase(&local_4d10,&local_3e90);
    OpenMD::operator||(&local_2df0,
                       &local_3050.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4d10.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3eb0,"NPTsz",&local_4d96);
    isEqualIgnoreCase(&local_4d50,&local_3eb0);
    OpenMD::operator||(&local_2650,
                       &local_2df0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4d50.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3ed0,"NPAT",&local_4d97);
    isEqualIgnoreCase(&local_4c10,&local_3ed0);
    OpenMD::operator||(&local_2150,
                       &local_2650.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4c10.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f30,"NPA",&local_4d98);
    isEqualIgnoreCase(&local_3f10,&local_3f30);
    OpenMD::operator||(&local_2430,
                       &local_2150.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_3f10.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3f90,"LANGEVINDYNAMICS",&local_4d99);
    isEqualIgnoreCase(&local_3f70,&local_3f90);
    OpenMD::operator||(&local_1430,
                       &local_2430.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_3f70.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3ff0,"LD",&local_4d9a);
    isEqualIgnoreCase(&local_3fd0,&local_3ff0);
    OpenMD::operator||(&local_10f0,
                       &local_1430.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_3fd0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4050,"NPRT",&local_4d9b);
    isEqualIgnoreCase(&local_4030,&local_4050);
    OpenMD::operator||(&local_d50,
                       &local_10f0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4030.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40b0,"NPGT",&local_4d9c);
    isEqualIgnoreCase(&local_4090,&local_40b0);
    OpenMD::operator||(&local_490,
                       &local_d50.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4090.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4110,"NGammaT",&local_4d9d);
    isEqualIgnoreCase(&local_40f0,&local_4110);
    OpenMD::operator||(&local_950,
                       &local_490.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_40f0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4170,"NGT",&local_4d9e);
    isEqualIgnoreCase(&local_4150,&local_4170);
    OpenMD::operator||(&local_1950,
                       &local_950.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4150.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_41d0,"LANGEVINHULL",&local_4d9f);
    isEqualIgnoreCase(&local_41b0,&local_41d0);
    OpenMD::operator||(&local_1ed0,
                       &local_1950.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_41b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4230,"LHULL",&local_4da0);
    isEqualIgnoreCase(&local_4210,&local_4230);
    OpenMD::operator||(&local_2c30,
                       &local_1ed0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4290,"SMIPD",&local_4da1);
    isEqualIgnoreCase(&local_4270,&local_4290);
    OpenMD::operator||(&local_3df0,
                       &local_2c30.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_4270.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_42f0,"LANGEVINPISTON",&local_4da2);
    isEqualIgnoreCase(&local_42d0,&local_42f0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,&local_3df0.
                                super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                       ,&local_42d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    std::__cxx11::string::string((string *)&local_4310,(string *)&(this->Ensemble).data_);
    bVar6 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,&local_4310);
    std::__cxx11::string::~string((string *)&local_4310);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&oss);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_42d0);
    std::__cxx11::string::~string((string *)&local_42f0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_3df0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4270);
    std::__cxx11::string::~string((string *)&local_4290);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_2c30);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4210);
    std::__cxx11::string::~string((string *)&local_4230);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_1ed0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_41b0);
    std::__cxx11::string::~string((string *)&local_41d0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_1950);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4150);
    std::__cxx11::string::~string((string *)&local_4170);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_950);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_40f0);
    std::__cxx11::string::~string((string *)&local_4110);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_490);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4090);
    std::__cxx11::string::~string((string *)&local_40b0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_d50);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4030);
    std::__cxx11::string::~string((string *)&local_4050);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_10f0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3fd0);
    std::__cxx11::string::~string((string *)&local_3ff0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_1430);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3f70);
    std::__cxx11::string::~string((string *)&local_3f90);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_2430);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3f10);
    std::__cxx11::string::~string((string *)&local_3f30);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_2150);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4c10);
    std::__cxx11::string::~string((string *)&local_3ed0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_2650);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4d50);
    std::__cxx11::string::~string((string *)&local_3eb0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_2df0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4d10);
    std::__cxx11::string::~string((string *)&local_3e90);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_3050);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4cd0);
    std::__cxx11::string::~string((string *)&local_3e70);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint(&local_2ef0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4c90);
    std::__cxx11::string::~string((string *)&local_3e50);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint(&local_30f0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4c50);
    std::__cxx11::string::~string((string *)&local_3e30);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4d90);
    std::__cxx11::string::~string((string *)&local_3e10);
    if (!bVar6) {
      pcVar3 = (this->Ensemble).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4330,"NVE",&local_4d92);
      isEqualIgnoreCase(&local_4d90,&local_4330);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4350,"NVT",&local_4d93);
      isEqualIgnoreCase(&local_4c50,&local_4350);
      OpenMD::operator||(&local_30f0,
                         &local_4d90.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_4c50.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4370,"NPTi",&local_4d94);
      isEqualIgnoreCase(&local_4c90,&local_4370);
      OpenMD::operator||(&local_2ef0,
                         &local_30f0.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4c90.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4390,"NPTf",&local_4d95);
      isEqualIgnoreCase(&local_4cd0,&local_4390);
      OpenMD::operator||(&local_3050,
                         &local_2ef0.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4cd0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_43b0,"NPTxyz",&local_4d96)
      ;
      isEqualIgnoreCase(&local_4d10,&local_43b0);
      OpenMD::operator||(&local_2df0,
                         &local_3050.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4d10.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_43d0,"NPTsz",&local_4d97);
      isEqualIgnoreCase(&local_4d50,&local_43d0);
      OpenMD::operator||(&local_2650,
                         &local_2df0.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4d50.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_43f0,"NPAT",&local_4d98);
      isEqualIgnoreCase(&local_4c10,&local_43f0);
      OpenMD::operator||(&local_2150,
                         &local_2650.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4c10.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4410,"NPA",&local_4d99);
      isEqualIgnoreCase(&local_3f10,&local_4410);
      OpenMD::operator||(&local_2430,
                         &local_2150.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_3f10.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4430,"LANGEVINDYNAMICS",&local_4d9a);
      isEqualIgnoreCase(&local_3f70,&local_4430);
      OpenMD::operator||(&local_1430,
                         &local_2430.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_3f70.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4450,"LD",&local_4d9b);
      isEqualIgnoreCase(&local_3fd0,&local_4450);
      OpenMD::operator||(&local_10f0,
                         &local_1430.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_3fd0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4470,"NPRT",&local_4d9c);
      isEqualIgnoreCase(&local_4030,&local_4470);
      OpenMD::operator||(&local_d50,
                         &local_10f0.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4030.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4490,"NPGT",&local_4d9d);
      isEqualIgnoreCase(&local_4090,&local_4490);
      OpenMD::operator||(&local_490,
                         &local_d50.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4090.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_44b0,"NGammaT",&local_4d9e);
      isEqualIgnoreCase(&local_40f0,&local_44b0);
      OpenMD::operator||(&local_950,
                         &local_490.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_40f0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_44d0,"NGT",&local_4d9f);
      isEqualIgnoreCase(&local_4150,&local_44d0);
      OpenMD::operator||(&local_1950,
                         &local_950.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4150.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_44f0,"LANGEVINHULL",&local_4da0);
      isEqualIgnoreCase(&local_41b0,&local_44f0);
      OpenMD::operator||(&local_1ed0,
                         &local_1950.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_41b0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4510,"LHULL",&local_4da1);
      isEqualIgnoreCase(&local_4210,&local_4510);
      OpenMD::operator||(&local_2c30,
                         &local_1ed0.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4530,"SMIPD",&local_4da2);
      isEqualIgnoreCase(&local_4270,&local_4530);
      OpenMD::operator||(&local_3df0,
                         &local_2c30.
                          super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_4270.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4550,"LANGEVINPISTON",&local_4d91);
      isEqualIgnoreCase(&local_42d0,&local_4550);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,&local_3df0.
                                  super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                         ,&local_42d0.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>
                        );
      std::__cxx11::string::string((string *)local_3110,(string *)&oss);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,local_3110[0]);
      std::__cxx11::string::~string((string *)local_3110);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&oss);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_42d0);
      std::__cxx11::string::~string((string *)&local_4550);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_3df0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4270);
      std::__cxx11::string::~string((string *)&local_4530);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_2c30);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4210);
      std::__cxx11::string::~string((string *)&local_4510);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_1ed0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_41b0);
      std::__cxx11::string::~string((string *)&local_44f0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_1950);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4150);
      std::__cxx11::string::~string((string *)&local_44d0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_950);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_40f0);
      std::__cxx11::string::~string((string *)&local_44b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_490);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4090);
      std::__cxx11::string::~string((string *)&local_4490);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_d50);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4030);
      std::__cxx11::string::~string((string *)&local_4470);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_10f0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3fd0);
      std::__cxx11::string::~string((string *)&local_4450);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_1430);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3f70);
      std::__cxx11::string::~string((string *)&local_4430);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_2430);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_3f10);
      std::__cxx11::string::~string((string *)&local_4410);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_2150);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4c10);
      std::__cxx11::string::~string((string *)&local_43f0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_2650);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4d50);
      std::__cxx11::string::~string((string *)&local_43d0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_2df0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4d10);
      std::__cxx11::string::~string((string *)&local_43b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_3050);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4cd0);
      std::__cxx11::string::~string((string *)&local_4390);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint(&local_2ef0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4c90);
      std::__cxx11::string::~string((string *)&local_4370);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint(&local_30f0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4c50);
      std::__cxx11::string::~string((string *)&local_4350);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint(&local_4d90);
      std::__cxx11::string::~string((string *)&local_4330);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Dt).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->Dt).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->Dt).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->RunTime).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->RunTime).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->RunTime).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->FinalConfig).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    std::__cxx11::string::string((string *)&local_3df0,(string *)&(this->FinalConfig).data_);
    sVar5 = local_3df0.
            super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
            .description_._M_string_length;
    std::__cxx11::string::~string((string *)&local_3df0);
    std::__cxx11::string::~string((string *)&oss);
    if (sVar5 == 0) {
      pcVar3 = (this->FinalConfig).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SampleTime).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->SampleTime).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->SampleTime).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ResetTime).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->ResetTime).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->ResetTime).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->StatusTime).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->StatusTime).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->StatusTime).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->CutoffRadius).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->CutoffRadius).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->CutoffRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SwitchingRadius).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->SwitchingRadius).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->SwitchingRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Dielectric).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->Dielectric).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->Dielectric).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ThermalTime).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->ThermalTime).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->ThermalTime).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TauThermostat).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->TauThermostat).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->TauThermostat).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TauBarostat).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->TauBarostat).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->TauBarostat).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ZconsTime).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->ZconsTime).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->ZconsTime).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ZconsTol).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->ZconsTol).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->ZconsTol).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Seed).super_ParameterBase.empty_ == false) {
    isPositive();
    uVar4 = (this->Seed).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (uVar4 == 0) {
      pcVar3 = (this->Seed).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ZconsGap).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->ZconsGap).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->ZconsGap).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ZconsFixtime).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->ZconsFixtime).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->ZconsFixtime).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ThermodynamicIntegrationLambda).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->ThermodynamicIntegrationLambda).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ThermodynamicIntegrationK).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->ThermodynamicIntegrationK).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ForceFieldVariant).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    std::__cxx11::string::string((string *)&local_3df0,(string *)&(this->ForceFieldVariant).data_);
    sVar5 = local_3df0.
            super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
            .description_._M_string_length;
    std::__cxx11::string::~string((string *)&local_3df0);
    std::__cxx11::string::~string((string *)&oss);
    if (sVar5 == 0) {
      pcVar3 = (this->ForceFieldVariant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ForceFieldFileName).super_ParameterBase.empty_ == false) {
    isNotEmpty();
    std::__cxx11::string::string((string *)&local_3df0,(string *)&(this->ForceFieldFileName).data_);
    std::__cxx11::string::~string((string *)&local_3df0);
    std::__cxx11::string::~string((string *)&oss);
    if (local_3df0.
        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
        .description_._M_string_length == 0) {
      pcVar3 = (this->ForceFieldFileName).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNotEmpty();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->CutoffMethod).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4570,"HARD",(allocator<char> *)&local_2150);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_950,&local_4570);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4590,"SWITCHED",(allocator<char> *)&local_2650);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_490,&local_4590);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_1950,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_950,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_490);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_45b0,"SHIFTED_POTENTIAL",(allocator<char> *)&local_2df0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_d50,&local_45b0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_1ed0,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_1950,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_d50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_45d0,"SHIFTED_FORCE",(allocator<char> *)&local_3050);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_10f0,&local_45d0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_2c30,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_1ed0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_10f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_45f0,"TAYLOR_SHIFTED",(allocator<char> *)&local_2ef0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1430,&local_45f0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_3df0,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_2c30,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4610,"EWALD_FULL",(allocator<char> *)&local_30f0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2430,&local_4610);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,(ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                                *)&local_3df0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2430);
    std::__cxx11::string::string((string *)&local_4630,(string *)&(this->CutoffMethod).data_);
    bVar6 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,&local_4630);
    std::__cxx11::string::~string((string *)&local_4630);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&oss);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2430);
    std::__cxx11::string::~string((string *)&local_4610);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_3df0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_1430);
    std::__cxx11::string::~string((string *)&local_45f0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_2c30);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_10f0);
    std::__cxx11::string::~string((string *)&local_45d0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_1ed0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_d50);
    std::__cxx11::string::~string((string *)&local_45b0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_1950);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_490);
    std::__cxx11::string::~string((string *)&local_4590);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_950);
    std::__cxx11::string::~string((string *)&local_4570);
    if (!bVar6) {
      pcVar3 = (this->CutoffMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4650,"HARD",(allocator<char> *)&local_2650);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_950,&local_4650);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4670,"SWITCHED",(allocator<char> *)&local_2df0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_490,&local_4670);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_1950,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_950,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_490);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4690,"SHIFTED_POTENTIAL",(allocator<char> *)&local_3050);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_d50,&local_4690);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_1ed0,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_1950,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_d50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_46b0,"SHIFTED_FORCE",(allocator<char> *)&local_2ef0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_10f0,&local_46b0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_2c30,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_1ed0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_10f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_46d0,"TAYLOR_SHIFTED",(allocator<char> *)&local_30f0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1430,&local_46d0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_3df0,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_2c30,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1430);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_46f0,"EWALD_FULL",(allocator<char> *)&local_4d90);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2430,&local_46f0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,(ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                                  *)&local_3df0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2430);
      std::__cxx11::string::string((string *)&local_2150,(string *)&oss);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_2150.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_2150);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&oss);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2430);
      std::__cxx11::string::~string((string *)&local_46f0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_3df0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_1430);
      std::__cxx11::string::~string((string *)&local_46d0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_2c30);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_10f0);
      std::__cxx11::string::~string((string *)&local_46b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_1ed0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_d50)
      ;
      std::__cxx11::string::~string((string *)&local_4690);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_1950);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_490)
      ;
      std::__cxx11::string::~string((string *)&local_4670);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_950)
      ;
      std::__cxx11::string::~string((string *)&local_4650);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ElectrostaticSummationMethod).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4710,"NONE",(allocator<char> *)&local_2ef0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_d50,&local_4710);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4730,"HARD",(allocator<char> *)&local_30f0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_10f0,&local_4730);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_490,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_d50,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_10f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4750,"SWITCHED",(allocator<char> *)&local_4d90);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1430,&local_4750);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_950,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_490,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4770,"SHIFTED_POTENTIAL",(allocator<char> *)&local_4c50);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2430,&local_4770);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_1950,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_950,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2430);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4790,"SHIFTED_FORCE",(allocator<char> *)&local_4c90);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2150,&local_4790);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_1ed0,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_1950,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2150);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_47b0,"REACTION_FIELD",(allocator<char> *)&local_4cd0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2650,&local_47b0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_2c30,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_1ed0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2650);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_47d0,"TAYLOR_SHIFTED",(allocator<char> *)&local_4d10);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2df0,&local_47d0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_3df0,
                       (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                        *)&local_2c30,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2df0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_47f0,"EWALD_FULL",(allocator<char> *)&local_4d50);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3050,&local_47f0);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,(ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                                *)&local_3df0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_3050);
    std::__cxx11::string::string
              ((string *)&local_4810,(string *)&(this->ElectrostaticSummationMethod).data_);
    bVar6 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,&local_4810);
    std::__cxx11::string::~string((string *)&local_4810);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&oss);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_3050);
    std::__cxx11::string::~string((string *)&local_47f0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_3df0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2df0);
    std::__cxx11::string::~string((string *)&local_47d0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_2c30);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2650);
    std::__cxx11::string::~string((string *)&local_47b0);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_1ed0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2150);
    std::__cxx11::string::~string((string *)&local_4790);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_1950);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2430);
    std::__cxx11::string::~string((string *)&local_4770);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&local_950);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_1430);
    std::__cxx11::string::~string((string *)&local_4750);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_490);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_10f0);
    std::__cxx11::string::~string((string *)&local_4730);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_d50);
    std::__cxx11::string::~string((string *)&local_4710);
    if (!bVar6) {
      pcVar3 = (this->ElectrostaticSummationMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4830,"NONE",(allocator<char> *)&local_30f0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_d50,&local_4830);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4850,"HARD",(allocator<char> *)&local_4d90);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_10f0,&local_4850);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_490,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_d50,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_10f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4870,"SWITCHED",(allocator<char> *)&local_4c50);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1430,&local_4870);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_950,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_490,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1430);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4890,"SHIFTED_POTENTIAL",(allocator<char> *)&local_4c90);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2430,&local_4890);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_1950,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_950,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2430);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48b0,"SHIFTED_FORCE",(allocator<char> *)&local_4cd0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2150,&local_48b0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_1ed0,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_1950,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2150);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48d0,"REACTION_FIELD",(allocator<char> *)&local_4d10);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2650,&local_48d0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_2c30,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_1ed0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2650);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48f0,"TAYLOR_SHIFTED",(allocator<char> *)&local_4d50);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2df0,&local_48f0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_3df0,
                         (ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                          *)&local_2c30,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2df0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4910,"EWALD_FULL",(allocator<char> *)&local_4c10);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3050,&local_4910);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,(ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                                  *)&local_3df0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_3050);
      std::__cxx11::string::string((string *)&local_2ef0,(string *)&oss);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_2ef0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_2ef0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&oss);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_3050);
      std::__cxx11::string::~string((string *)&local_4910);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_3df0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2df0);
      std::__cxx11::string::~string((string *)&local_48f0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_2c30);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2650);
      std::__cxx11::string::~string((string *)&local_48d0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_1ed0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2150);
      std::__cxx11::string::~string((string *)&local_48b0);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_1950);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2430);
      std::__cxx11::string::~string((string *)&local_4890);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&local_950);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_1430);
      std::__cxx11::string::~string((string *)&local_4870);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_490);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_10f0);
      std::__cxx11::string::~string((string *)&local_4850);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_d50)
      ;
      std::__cxx11::string::~string((string *)&local_4830);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->ElectrostaticScreeningMethod).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4930,"UNDAMPED",(allocator<char> *)&local_1ed0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3df0,&local_4930);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4950,"DAMPED",(allocator<char> *)&local_1950);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_4950);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,(ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                               &local_3df0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30);
    std::__cxx11::string::string
              ((string *)&local_4970,(string *)&(this->ElectrostaticScreeningMethod).data_);
    bVar6 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,&local_4970);
    std::__cxx11::string::~string((string *)&local_4970);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2c30);
    std::__cxx11::string::~string((string *)&local_4950);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_3df0);
    std::__cxx11::string::~string((string *)&local_4930);
    if (!bVar6) {
      pcVar3 = (this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4990,"UNDAMPED",(allocator<char> *)&local_1950);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3df0,&local_4990);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_49b0,"DAMPED",(allocator<char> *)&local_950);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_49b0);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,(ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                                 &local_3df0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30);
      std::__cxx11::string::string((string *)&local_1ed0,(string *)&oss);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1ed0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1ed0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2c30);
      std::__cxx11::string::~string((string *)&local_49b0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_3df0);
      std::__cxx11::string::~string((string *)&local_4990);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SwitchingFunctionType).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_49d0,"CUBIC",(allocator<char> *)&local_1ed0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3df0,&local_49d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_49f0,"FIFTH_ORDER_POLYNOMIAL",(allocator<char> *)&local_1950);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_49f0);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,(ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                               &local_3df0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30);
    std::__cxx11::string::string
              ((string *)&local_4a10,(string *)&(this->SwitchingFunctionType).data_);
    bVar6 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,&local_4a10);
    std::__cxx11::string::~string((string *)&local_4a10);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2c30);
    std::__cxx11::string::~string((string *)&local_49f0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_3df0);
    std::__cxx11::string::~string((string *)&local_49d0);
    if (!bVar6) {
      pcVar3 = (this->SwitchingFunctionType).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a30,"CUBIC",(allocator<char> *)&local_1950);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3df0,&local_4a30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a50,"FIFTH_ORDER_POLYNOMIAL",(allocator<char> *)&local_950);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_4a50);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,(ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                                 &local_3df0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30);
      std::__cxx11::string::string((string *)&local_1ed0,(string *)&oss);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1ed0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1ed0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2c30);
      std::__cxx11::string::~string((string *)&local_4a50);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_3df0);
      std::__cxx11::string::~string((string *)&local_4a30);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->OrthoBoxTolerance).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->OrthoBoxTolerance).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->OrthoBoxTolerance).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DampingAlpha).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->DampingAlpha).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->DampingAlpha).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SkinThickness).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->SkinThickness).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->SkinThickness).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Viscosity).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar1 = (this->Viscosity).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 < 0.0) {
      pcVar3 = (this->Viscosity).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->BeadSize).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->BeadSize).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->BeadSize).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->FrozenBufferRadius).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->FrozenBufferRadius).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->FrozenBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->LangevinBufferRadius).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->LangevinBufferRadius).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->LangevinBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->NeighborListNeighbors).super_ParameterBase.empty_ == false) {
    isPositive();
    iVar2 = *(int *)&(this->NeighborListNeighbors).super_ParameterBase.field_0x2c;
    std::__cxx11::string::~string((string *)&oss);
    if (iVar2 < 1) {
      pcVar3 = (this->NeighborListNeighbors).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->HULL_Method).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a70,"Convex",(allocator<char> *)&local_1ed0);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3df0,&local_4a70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a90,"AlphaShape",(allocator<char> *)&local_1950);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_4a90);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,(ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                               &local_3df0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30);
    std::__cxx11::string::string((string *)&local_4ab0,(string *)&(this->HULL_Method).data_);
    bVar6 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,&local_4ab0);
    std::__cxx11::string::~string((string *)&local_4ab0);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2c30);
    std::__cxx11::string::~string((string *)&local_4a90);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_3df0);
    std::__cxx11::string::~string((string *)&local_4a70);
    if (!bVar6) {
      pcVar3 = (this->HULL_Method).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4ad0,"Convex",(allocator<char> *)&local_1950);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_3df0,&local_4ad0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4af0,"AlphaShape",(allocator<char> *)&local_950);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_4af0);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,(ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)
                                 &local_3df0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30);
      std::__cxx11::string::string((string *)&local_1ed0,(string *)&oss);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1ed0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1ed0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2c30);
      std::__cxx11::string::~string((string *)&local_4af0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_3df0);
      std::__cxx11::string::~string((string *)&local_4ad0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->Alpha).super_ParameterBase.empty_ == false) {
    isPositive();
    dVar1 = (this->Alpha).data_;
    std::__cxx11::string::~string((string *)&oss);
    if (dVar1 <= 0.0) {
      pcVar3 = (this->Alpha).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->StatFilePrecision).super_ParameterBase.empty_ == false) {
    isPositive();
    iVar2 = *(int *)&(this->StatFilePrecision).super_ParameterBase.field_0x2c;
    std::__cxx11::string::~string((string *)&oss);
    if (iVar2 < 1) {
      pcVar3 = (this->StatFilePrecision).super_ParameterBase.keyword_._M_dataplus._M_p;
      isPositive();
      std::__cxx11::string::string((string *)&oss,(string *)&local_3df0);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,_oss);
      std::__cxx11::string::~string((string *)&oss);
      std::__cxx11::string::~string((string *)&local_3df0);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->PrivilegedAxis).super_ParameterBase.empty_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b10,"x",(allocator<char> *)&local_950);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_4b10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b30,"y",(allocator<char> *)&local_490);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1ed0,&local_4b30);
    OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_3df0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1ed0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b50,"z",(allocator<char> *)&local_d50);
    isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1950,&local_4b50);
    OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&oss,(ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                                *)&local_3df0,
                       (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1950);
    std::__cxx11::string::string((string *)&local_4b70,(string *)&(this->PrivilegedAxis).data_);
    bVar6 = OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
            ::operator()((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,&local_4b70);
    std::__cxx11::string::~string((string *)&local_4b70);
    OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
    ::~OrParamConstraint
              ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                *)&oss);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_1950);
    std::__cxx11::string::~string((string *)&local_4b50);
    OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
    ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_3df0);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_1ed0);
    std::__cxx11::string::~string((string *)&local_4b30);
    EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint((EqualIgnoreCaseConstraint *)&local_2c30);
    std::__cxx11::string::~string((string *)&local_4b10);
    if (!bVar6) {
      pcVar3 = (this->PrivilegedAxis).super_ParameterBase.keyword_._M_dataplus._M_p;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4b90,"x",(allocator<char> *)&local_490);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_2c30,&local_4b90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4bb0,"y",(allocator<char> *)&local_d50);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1ed0,&local_4bb0);
      OpenMD::operator||((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_3df0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_2c30,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1ed0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4bd0,"z",(allocator<char> *)&local_10f0);
      isEqualIgnoreCase((EqualIgnoreCaseConstraint *)&local_1950,&local_4bd0);
      OpenMD::operator||((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&oss,(ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                                  *)&local_3df0,
                         (ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint> *)&local_1950);
      std::__cxx11::string::string((string *)&local_950,(string *)&oss);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_950.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_950);
      OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
      ::~OrParamConstraint
                ((OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                  *)&oss);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_1950);
      std::__cxx11::string::~string((string *)&local_4bd0);
      OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>::
      ~OrParamConstraint((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>
                          *)&local_3df0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_1ed0);
      std::__cxx11::string::~string((string *)&local_4bb0);
      EqualIgnoreCaseConstraint::~EqualIgnoreCaseConstraint
                ((EqualIgnoreCaseConstraint *)&local_2c30);
      std::__cxx11::string::~string((string *)&local_4b90);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  ppCVar8 = (this->components_).
            super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppCVar8 ==
        (this->components_).
        super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    bVar6 = Component::findMoleculeStamp(*ppCVar8,&this->moleculeStamps_);
    if (!bVar6) break;
    ppCVar8 = ppCVar8 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar7 = std::operator<<((ostream *)&oss,
                           "Globals Error: can not find molecule stamp for component ");
  std::__cxx11::string::string((string *)&local_3df0,(string *)&((*ppCVar8)->Type).data_);
  poVar7 = std::operator<<(poVar7,(string *)&local_3df0);
  std::endl<char,std::char_traits<char>>(poVar7);
  std::__cxx11::string::~string((string *)&local_3df0);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,(string *)&local_3df0);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void Globals::validate() {
    DataHolder::validate();

    CheckParameter(ForceField, isNotEmpty());
    CheckParameter(TargetTemp, isPositive());
    CheckParameter(
        Ensemble,
        isEqualIgnoreCase("NVE") || isEqualIgnoreCase("NVT") ||
            isEqualIgnoreCase("NPTi") || isEqualIgnoreCase("NPTf") ||
            isEqualIgnoreCase("NPTxyz") || isEqualIgnoreCase("NPTsz") ||
            isEqualIgnoreCase("NPAT") || isEqualIgnoreCase("NPA") ||
            isEqualIgnoreCase("LANGEVINDYNAMICS") || isEqualIgnoreCase("LD") ||
            isEqualIgnoreCase("NPRT") || isEqualIgnoreCase("NPGT") ||
            isEqualIgnoreCase("NGammaT") || isEqualIgnoreCase("NGT") ||
            isEqualIgnoreCase("LANGEVINHULL") || isEqualIgnoreCase("LHULL") ||
            isEqualIgnoreCase("SMIPD") || isEqualIgnoreCase("LANGEVINPISTON"));
    CheckParameter(Dt, isPositive());
    CheckParameter(RunTime, isPositive());
    CheckParameter(FinalConfig, isNotEmpty());
    CheckParameter(SampleTime, isNonNegative());
    CheckParameter(ResetTime, isNonNegative());
    CheckParameter(StatusTime, isNonNegative());
    CheckParameter(CutoffRadius, isPositive());
    CheckParameter(SwitchingRadius, isNonNegative());
    CheckParameter(Dielectric, isPositive());
    CheckParameter(ThermalTime, isNonNegative());
    CheckParameter(TauThermostat, isPositive());
    CheckParameter(TauBarostat, isPositive());
    CheckParameter(ZconsTime, isPositive());
    CheckParameter(ZconsTol, isPositive());
    CheckParameter(Seed, isPositive());
    CheckParameter(ZconsGap, isPositive());
    CheckParameter(ZconsFixtime, isPositive());
    CheckParameter(ThermodynamicIntegrationLambda, isNonNegative());
    CheckParameter(ThermodynamicIntegrationK, isPositive());
    CheckParameter(ForceFieldVariant, isNotEmpty());
    CheckParameter(ForceFieldFileName, isNotEmpty());
    CheckParameter(CutoffMethod, isEqualIgnoreCase("HARD") ||
                                     isEqualIgnoreCase("SWITCHED") ||
                                     isEqualIgnoreCase("SHIFTED_POTENTIAL") ||
                                     isEqualIgnoreCase("SHIFTED_FORCE") ||
                                     isEqualIgnoreCase("TAYLOR_SHIFTED") ||
                                     isEqualIgnoreCase("EWALD_FULL"));
    CheckParameter(ElectrostaticSummationMethod,
                   isEqualIgnoreCase("NONE") || isEqualIgnoreCase("HARD") ||
                       isEqualIgnoreCase("SWITCHED") ||
                       isEqualIgnoreCase("SHIFTED_POTENTIAL") ||
                       isEqualIgnoreCase("SHIFTED_FORCE") ||
                       isEqualIgnoreCase("REACTION_FIELD") ||
                       isEqualIgnoreCase("TAYLOR_SHIFTED") ||
                       isEqualIgnoreCase("EWALD_FULL"));
    CheckParameter(
        ElectrostaticScreeningMethod,
        isEqualIgnoreCase("UNDAMPED") || isEqualIgnoreCase("DAMPED"));
    CheckParameter(SwitchingFunctionType,
                   isEqualIgnoreCase("CUBIC") ||
                       isEqualIgnoreCase("FIFTH_ORDER_POLYNOMIAL"));
    CheckParameter(OrthoBoxTolerance, isPositive());
    CheckParameter(DampingAlpha, isNonNegative());
    CheckParameter(SkinThickness, isPositive());
    CheckParameter(Viscosity, isNonNegative());
    CheckParameter(BeadSize, isPositive());
    CheckParameter(FrozenBufferRadius, isPositive());
    CheckParameter(LangevinBufferRadius, isPositive());
    CheckParameter(NeighborListNeighbors, isPositive());
    CheckParameter(HULL_Method, isEqualIgnoreCase("Convex") ||
                                    isEqualIgnoreCase("AlphaShape"));
    CheckParameter(Alpha, isPositive());
    CheckParameter(StatFilePrecision, isPositive());
    CheckParameter(PrivilegedAxis, isEqualIgnoreCase("x") ||
                                       isEqualIgnoreCase("y") ||
                                       isEqualIgnoreCase("z"));

    for (std::vector<Component*>::iterator i = components_.begin();
         i != components_.end(); ++i) {
      if (!(*i)->findMoleculeStamp(moleculeStamps_)) {
        std::ostringstream oss;
        oss << "Globals Error: can not find molecule stamp for component "
            << (*i)->getType() << std::endl;
        throw OpenMDException(oss.str());
      }
    }
  }